

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O0

void __thiscall
SchemaConverter::_not_strings(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
string>>const&)::TrieNode::insert(std::__cxx11::string_const__(TrieNode *this,string *string)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__lhs;
  reference pcVar2;
  mapped_type *in_RDI;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  TrieNode *node;
  undefined7 in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffcf;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28 [2];
  mapped_type *local_18;
  
  local_18 = in_RDI;
  local_28[0]._M_current = (char *)std::__cxx11::string::begin();
  __lhs = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_28);
    in_stack_ffffffffffffffcf = *pcVar2;
    local_18 = std::
               map<char,_TrieNode,_std::less<char>,_std::allocator<std::pair<const_char,_TrieNode>_>_>
               ::operator[]((map<char,_TrieNode,_std::less<char>,_std::allocator<std::pair<const_char,_TrieNode>_>_>
                             *)__begin2._M_current,__end2._M_current);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_28);
  }
  local_18->is_end_of_string = true;
  return;
}

Assistant:

void insert(const std::string & string) {
                auto node = this;
                for (char c : string) {
                    node = &node->children[c];
                }
                node->is_end_of_string = true;
            }